

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

void kokkosp_parse_args(int argc,char **argv)

{
  if (argc != 1) {
    if (argc != 2) {
      kokkosp_print_help(*argv);
      exit(1);
    }
    KokkosTools::SpaceTimeStack::output_threshold = strtod(argv[1],(char **)0x0);
  }
  return;
}

Assistant:

void kokkosp_parse_args(int argc, char** argv) {
  // See description in original PR.
  // argc will always be at least 1 (exe)
  if (argc == 1) {
    // No argument, use the default
  } else if (argc == 2) {
    // User specified a threshold
    output_threshold = strtod(argv[1], 0);
  } else {
    // Too many args
    kokkosp_print_help(argv[0]);
    exit(1);
  }
}